

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O2

_Bool CompareStructType(StructType *struct1,StructType *struct2)

{
  size_t sVar1;
  _Bool _Var2;
  _Bool _Var3;
  long lVar4;
  SubStructType *subStruct2;
  SubStructType *subStruct1;
  bool bVar5;
  
  _Var2 = CompareSubStructType(&struct1->subStruct,&struct2->subStruct);
  sVar1 = struct1->subStructArrayCount;
  bVar5 = sVar1 == struct2->subStructArrayCount;
  if (bVar5) {
    lVar4 = sVar1 + 1;
    subStruct2 = struct2->subStructArray;
    subStruct1 = struct1->subStructArray;
    do {
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) {
        return bVar5 && _Var2;
      }
      _Var3 = CompareSubStructType(subStruct1,subStruct2);
      subStruct2 = subStruct2 + 1;
      subStruct1 = subStruct1 + 1;
    } while (_Var3);
  }
  return false;
}

Assistant:

static
bool
    CompareStructType
    (
        StructType const*       struct1,
        StructType const*       struct2
    )
{
    bool same = true;

    if( !CompareSubStructType( &struct1->subStruct, &struct2->subStruct ) ) { same = false; }
    if( struct1->subStructArrayCount != struct2->subStructArrayCount ) { same = false; }
    if( struct1->subStructArrayCount == struct2->subStructArrayCount )
    {
        for( size_t i=0; i<struct1->subStructArrayCount; i++ )
        {
            if( !CompareSubStructType( &struct1->subStructArray[i], &struct2->subStructArray[i] ) ) { same = false; break; }
        }
    }

    return same;
}